

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

int uv_thread_create_ex(uv_thread_t *tid,uv_thread_options_t *params,_func_void_void_ptr *entry,
                       void *arg)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 __stacksize;
  size_t sVar4;
  pthread_attr_t *__attr;
  pthread_attr_t attr_storage;
  pthread_attr_t local_60;
  
  if ((params->flags & 1) == 0) {
    sVar4 = 0;
  }
  else {
    sVar4 = params->stack_size;
  }
  if (sVar4 == 0) {
    iVar1 = getrlimit(RLIMIT_STACK,(rlimit *)&local_60);
    if (iVar1 != 0) goto LAB_004d9f61;
    __stacksize = 0x200000;
    if (local_60.__align != 0xffffffffffffffff) {
      iVar1 = getpagesize();
      uVar2 = local_60.__align - (ulong)local_60.__align % (ulong)(long)iVar1;
      local_60.__align = uVar2;
      if (0x1fff < uVar2) {
        uVar3 = __sysconf(0x4b);
        __stacksize = 0x200000;
        if (uVar3 <= uVar2) {
          __stacksize = local_60.__align;
        }
      }
    }
  }
  else {
    iVar1 = getpagesize();
    __stacksize = -(long)iVar1 & ((long)iVar1 + sVar4) - 1;
    uVar2 = __sysconf(0x4b);
    if ((ulong)__stacksize < uVar2) {
      __stacksize = __sysconf(0x4b);
    }
  }
  if (__stacksize != 0) {
    __attr = &local_60;
    iVar1 = pthread_attr_init(__attr);
    if (iVar1 == 0) {
      iVar1 = pthread_attr_setstacksize(__attr,__stacksize);
      if (iVar1 == 0) goto LAB_004d9f69;
    }
LAB_004d9f61:
    abort();
  }
  __attr = (pthread_attr_t *)0x0;
LAB_004d9f69:
  iVar1 = pthread_create(tid,__attr,(__start_routine *)entry,arg);
  if (__attr != (pthread_attr_t *)0x0) {
    pthread_attr_destroy(__attr);
  }
  return -iVar1;
}

Assistant:

int uv_thread_create_ex(uv_thread_t* tid,
                        const uv_thread_options_t* params,
                        void (*entry)(void *arg),
                        void *arg) {
  int err;
  pthread_attr_t* attr;
  pthread_attr_t attr_storage;
  size_t pagesize;
  size_t stack_size;

  stack_size =
      params->flags & UV_THREAD_HAS_STACK_SIZE ? params->stack_size : 0;

  attr = NULL;
  if (stack_size == 0) {
    stack_size = thread_stack_size();
  } else {
    pagesize = (size_t)getpagesize();
    /* Round up to the nearest page boundary. */
    stack_size = (stack_size + pagesize - 1) &~ (pagesize - 1);
#ifdef PTHREAD_STACK_MIN
    if (stack_size < PTHREAD_STACK_MIN)
      stack_size = PTHREAD_STACK_MIN;
#endif
  }

  if (stack_size > 0) {
    attr = &attr_storage;

    if (pthread_attr_init(attr))
      abort();

    if (pthread_attr_setstacksize(attr, stack_size))
      abort();
  }

  err = pthread_create(tid, attr, (void*(*)(void*)) entry, arg);

  if (attr != NULL)
    pthread_attr_destroy(attr);

  return UV__ERR(err);
}